

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape_string.cpp
# Opt level: O1

string * libtorrent::convert_to_native(string *__return_storage_ptr__,string *s)

{
  bool bVar1;
  wchar_t __wc;
  pair<int,_int> pVar2;
  size_t sVar3;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *pcVar4;
  size_t i;
  size_t sVar5;
  aux *paVar6;
  pointer pcVar7;
  aux *this;
  aux *paVar8;
  string_view str;
  char out [10];
  mbstate_t local_48;
  char local_3a [10];
  
  bVar1 = anon_unknown_5::need_conversion();
  if (bVar1) {
    local_48.__count = 0;
    local_48.__value = (_union_27)0x0;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if ((aux *)s->_M_string_length != (aux *)0x0) {
      pcVar7 = (s->_M_dataplus)._M_p;
      pcVar4 = extraout_RDX;
      this = (aux *)s->_M_string_length;
      do {
        str._M_str = pcVar4;
        str._M_len = (size_t)pcVar7;
        pVar2 = aux::parse_utf8_codepoint(this,str);
        paVar6 = (aux *)((long)pVar2 >> 0x20);
        paVar8 = this + -(long)paVar6;
        if (this < paVar6) {
          ::std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                     paVar6,this);
        }
        __wc = pVar2.first;
        if (__wc == L'\xffffffff') {
          __wc = L'.';
        }
        sVar3 = wcrtomb(local_3a,__wc,&local_48);
        if (sVar3 == 0xffffffffffffffff) {
          ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
          local_48.__count = 0;
          local_48.__value = (_union_27)0x0;
          pcVar4 = extraout_RDX_02;
        }
        else {
          pcVar4 = extraout_RDX_00;
          if (sVar3 != 0) {
            sVar5 = 0;
            do {
              ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
              sVar5 = sVar5 + 1;
              pcVar4 = extraout_RDX_01;
            } while (sVar3 != sVar5);
          }
        }
        pcVar7 = pcVar7 + (long)paVar6;
        this = paVar8;
      } while (paVar8 != (aux *)0x0);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar7 = (s->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar7,pcVar7 + s->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string convert_to_native(std::string const& s)
	{
		if (!need_conversion()) return s;

		std::mbstate_t state{};
		std::string ret;
		string_view ptr = s;
		while (!ptr.empty())
		{
			// decode a single utf-8 character
			auto [codepoint, len] = aux::parse_utf8_codepoint(ptr);

			if (codepoint == -1)
				codepoint = '.';

			ptr = ptr.substr(std::size_t(len));

			char out[10];
			std::size_t const size = std::wcrtomb(out, static_cast<wchar_t>(codepoint), &state);
			if (size == static_cast<std::size_t>(-1))
			{
				ret += '.';
				state = std::mbstate_t{};
			}
			else
				for (std::size_t i = 0; i < size; ++i)
					ret += out[i];
		}
		return ret;
	}